

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCenterLineProfileDef::~IfcCenterLineProfileDef
          (IfcCenterLineProfileDef *this,void **vtt)

{
  void **vtt_local;
  IfcCenterLineProfileDef *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCenterLineProfileDef,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCenterLineProfileDef,_1UL> *)
             &(this->super_IfcArbitraryOpenProfileDef).field_0x70,vtt + 10);
  IfcArbitraryOpenProfileDef::~IfcArbitraryOpenProfileDef
            (&this->super_IfcArbitraryOpenProfileDef,vtt + 1);
  return;
}

Assistant:

IfcCenterLineProfileDef() : Object("IfcCenterLineProfileDef") {}